

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v2mconv.cpp
# Opt level: O2

void ConvertV2M(uchar *inptr,int inlen,uchar **outptr,int *outlen)

{
  uchar uVar1;
  byte bVar2;
  int iVar3;
  uint8_t *puVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uchar *__s;
  uchar *puVar8;
  int iVar9;
  uint uVar10;
  byte bVar11;
  size_t __n;
  byte *pbVar12;
  byte *pbVar13;
  byte *pbVar14;
  V2PARAM *pVVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  int q;
  ssbase base;
  
  iVar5 = CheckV2MVersion(inptr,inlen,&base);
  puVar4 = base.patchmap;
  if (iVar5 == 0) {
    iVar5 = inlen + 4;
    pbVar12 = (byte *)operator_new__((long)iVar5);
    *outptr = pbVar12;
    memset(pbVar12,0,(long)iVar5);
    *outlen = iVar5;
    base.speechdata = inptr;
    base.spsize = inlen;
  }
  else {
    if (iVar5 < 0) {
      *outptr = (uchar *)0x0;
      *outlen = 0;
      return;
    }
    lVar17 = (long)v2version;
    iVar6 = (int)((long)*(int *)base.patchmap / 4);
    uVar16 = (long)*(int *)base.patchmap / 4 & 0xffffffff;
    iVar3 = v2vsizes[lVar17];
    lVar18 = lVar17 - iVar5;
    iVar5 = v2vsizes[lVar18];
    iVar9 = iVar6 * (iVar3 - iVar5);
    iVar7 = ((inlen + v2gsizes[lVar17]) - v2gsizes[lVar18]) + iVar9 + 4;
    *outlen = iVar7;
    base.maxp = iVar6;
    __s = (uchar *)operator_new__((long)iVar7);
    *outptr = __s;
    memset(__s,0,(long)iVar7);
    __n = (size_t)base.midisize;
    memcpy(__s,inptr,__n);
    puVar8 = __s + __n + 4;
    puVar8[-4] = '\x17';
    puVar8[-3] = '\0';
    puVar8[-2] = '\0';
    puVar8[-1] = '\0';
    puVar8[0xf] = '\x01';
    puVar8[0x10] = '\x02';
    puVar8[0x11] = 'Z';
    puVar8[0x12] = ' ';
    puVar8[0x13] = '\x14';
    puVar8[0x14] = '@';
    puVar8[0x15] = '@';
    puVar8[0x16] = '\0';
    puVar8[0] = '@';
    puVar8[1] = '@';
    puVar8[2] = ' ';
    puVar8[3] = '\x7f';
    puVar8[4] = 'd';
    puVar8[5] = 'P';
    puVar8[6] = '@';
    puVar8[7] = '@';
    puVar8[8] = '\0';
    puVar8[9] = '\0';
    puVar8[10] = '@';
    puVar8[0xb] = '\0';
    puVar8[0xc] = '\x7f';
    puVar8[0xd] = '\0';
    puVar8[0xe] = '\0';
    puVar8[0xf] = '\x01';
    for (lVar17 = 0; iVar7 = (int)lVar18, lVar17 != 0x450; lVar17 = lVar17 + 0x30) {
      if (*(int *)((long)&v2gparms[0].version + lVar17) <= iVar7) {
        uVar1 = *base.globals;
        base.globals = base.globals + 1;
        *puVar8 = uVar1;
      }
      puVar8 = puVar8 + 1;
    }
    *(int *)(__s + __n + 0x1b) = iVar9 + base.patchsize;
    base.newpatchmap = __s + __n + 0x1f;
    for (q = 0; q < iVar6; q = q + 1) {
      *(int *)(base.newpatchmap + (long)q * 4) =
           q * (iVar3 - iVar5) + *(int *)(puVar4 + (long)q * 4);
    }
    pbVar12 = base.newpatchmap + (iVar6 << 2);
    for (lVar17 = 0; lVar17 < (int)uVar16; lVar17 = lVar17 + 1) {
      pbVar14 = base.patchmap + *(uint *)(puVar4 + lVar17 * 4);
      memcpy(pbVar12,"@@\x01",0x59);
      pbVar13 = pbVar12;
      for (lVar18 = 0; pbVar12 = pbVar13 + 1, lVar18 != 0x10b0; lVar18 = lVar18 + 0x30) {
        if (*(int *)((long)&v2parms[0].version + lVar18) <= iVar7) {
          bVar2 = *pbVar14;
          pbVar14 = pbVar14 + 1;
          *pbVar13 = bVar2;
        }
        pbVar13 = pbVar12;
      }
      bVar2 = *pbVar14;
      pbVar14 = pbVar14 + 1;
      *pbVar13 = bVar2;
      for (uVar10 = 0; uVar10 != bVar2; uVar10 = uVar10 + 1) {
        *pbVar12 = *pbVar14;
        pbVar12[1] = pbVar14[1];
        bVar11 = pbVar14[2];
        pbVar12[2] = bVar11;
        pVVar15 = v2parms;
        for (uVar16 = 0; uVar16 <= bVar11; uVar16 = uVar16 + 1) {
          if (iVar7 < pVVar15->version) {
            bVar11 = bVar11 + 1;
            pbVar12[2] = bVar11;
          }
          pVVar15 = pVVar15 + 1;
        }
        pbVar12 = pbVar12 + 3;
        pbVar14 = pbVar14 + 3;
      }
      uVar16 = (ulong)(uint)base.maxp;
    }
    *(int *)pbVar12 = base.spsize;
    pbVar12 = pbVar12 + 4;
  }
  memcpy(pbVar12,base.speechdata,(long)base.spsize);
  return;
}

Assistant:

void ConvertV2M(const unsigned char *inptr, const int inlen, unsigned char **outptr, int *outlen)
{
    int i, p;
    ssbase base;
    // check version
    int vdelta = CheckV2MVersion(inptr, inlen, base);
    if (!vdelta) // if same, simply clone
    {
        *outptr = new uint8_t[inlen + 4];
        memset(*outptr, 0, inlen + 4);
        *outlen = inlen + 4;
        memcpy(*outptr, inptr, inlen);
        return;
    }
    else if (vdelta < 0) // if invalid...
    {
        *outptr = 0;
        *outlen = 0;
        return;
    }
    vdelta = v2version - vdelta;

    // fake base.maxp
    int maxp2 = ((int*)base.patchmap)[0]/4;
    if (maxp2 != base.maxp)
    {
        printf2("warning: patch count inconsistency: we:%d, they:%d\n", base.maxp, maxp2);
        base.maxp = maxp2;
    }

    // calc new size
    int gdiff = v2gsizes[v2version] - v2gsizes[vdelta];
    int pdiff = v2vsizes[v2version] - v2vsizes[vdelta];
    int newsize = inlen + gdiff + base.maxp*pdiff;
    printf2("old size: %d, new size: %d\n", inlen, newsize);

    // init new v2m
    *outlen = newsize + 4;
    uint8_t *newptr = *outptr = new uint8_t[newsize + 4];
    memset(newptr, 0, newsize + 4);

    // copy midi data
    memcpy(newptr, inptr, base.midisize);

    // new globals length...
    newptr += base.midisize;
    *(uint32_t *)newptr = v2ngparms;
    printf2("glob size: old %d, new %d\n", base.globsize, *(uint32_t *)newptr);
    newptr += 4;

    // copy/remap globals
    memcpy(newptr, v2initglobs, v2ngparms);
    const uint8_t *oldgptr = base.globals;
    for (i = 0; i < v2ngparms; i++)
    {
        if (v2gparms[i].version <= vdelta)
            newptr[i] = *oldgptr++;
    }
    newptr += v2ngparms;

    // new patch data length
    *(int *)newptr = base.patchsize + base.maxp*pdiff;
    printf2("patch size: old %d, new %d\n", base.patchsize, *(int *)newptr);
    newptr += 4;

    base.newpatchmap = newptr;

    uint32_t *poffsets = (uint32_t *)base.patchmap;
    uint32_t *noffsets = (uint32_t *)newptr;
    //const int ros = v2vsizes[vdelta] - 255*3 - 1;

    //uint8_t *nptr2 = newptr;

    // copy patch table...
    // gcc 5.3 seems to vectorize the loop, but
    // the loop is not correct for base.maxp == 10 at least
    // adding volatile to the iterator breaks the auto-vec
    for (volatile int q = 0; q < base.maxp; q++)
    {
        noffsets[q] = poffsets[q] + (q * pdiff);
    }

    newptr += 4*base.maxp;

    // for each patch...
    for (p = 0; p < base.maxp; p++)
    {
        const uint8_t *src = base.patchmap + poffsets[p];

        //const uint8_t *dest_soll = nptr2 + noffsets[p];
        printf2("p%d ist:%08x soll:%08x\n", p, newptr, dest_soll);

        // fill patch with default values
        memcpy(newptr, v2initsnd, v2nparms);

        // copy/remap patch data
        for (i = 0; i < v2nparms; i++)
        {
            if (v2parms[i].version <= vdelta)
            {
                *newptr = *src++;
                /*
                if (vdelta < 2 && (i == 33 || i == 36 || i == 39 || i == 42)) // fix envelopes
                    *newptr=transEnv(*newptr); */
            }
            newptr++;
        }

        // copy mod number
        const int modnum = *newptr ++= *src++;
        //        printf2("patch %d: %d mods\n",p,modnum);

        // copy/remap modulations
        for (i = 0; i < modnum; i++)
        {
            newptr[0] = src[0];
            newptr[1] = src[1];
            newptr[2] = src[2];
            for (int k = 0; k <= newptr[2]; k++)
                if (v2parms[k].version > vdelta) newptr[2]++;
            newptr += 3;
            src += 3;
        }
    }

    // copy speech
    *(uint32_t*)newptr = base.spsize;
    newptr += 4;
    memcpy(newptr, base.speechdata, base.spsize);
    newptr += base.spsize;

    printf2("est size: %d, real size: %d\n", newsize, newptr - *outptr);
}